

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerProtocol.cxx
# Opt level: O0

Value * DumpBacktrace(Value *__return_storage_ptr__,cmListFileBacktrace *backtrace)

{
  byte bVar1;
  cmListFileContext *pcVar2;
  Value *pVVar3;
  ulong uVar4;
  cmListFileBacktrace local_110;
  Value local_f0;
  Value local_c8;
  Value local_a0;
  undefined1 local_78 [8];
  Value entry;
  undefined1 local_40 [8];
  cmListFileBacktrace backtraceCopy;
  cmListFileBacktrace *backtrace_local;
  Value *result;
  
  backtraceCopy.Cur._7_1_ = 0;
  Json::Value::Value(__return_storage_ptr__,arrayValue);
  cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)local_40,backtrace);
  while( true ) {
    cmListFileBacktrace::Top((cmListFileBacktrace *)local_40);
    bVar1 = std::__cxx11::string::empty();
    if (((bVar1 ^ 0xff) & 1) == 0) break;
    Json::Value::Value((Value *)local_78,objectValue);
    pcVar2 = cmListFileBacktrace::Top((cmListFileBacktrace *)local_40);
    Json::Value::Value(&local_a0,&pcVar2->FilePath);
    pVVar3 = Json::Value::operator[]((Value *)local_78,&kPATH_KEY_abi_cxx11_);
    Json::Value::operator=(pVVar3,&local_a0);
    Json::Value::~Value(&local_a0);
    pcVar2 = cmListFileBacktrace::Top((cmListFileBacktrace *)local_40);
    if (pcVar2->Line != 0) {
      pcVar2 = cmListFileBacktrace::Top((cmListFileBacktrace *)local_40);
      Json::Value::Value(&local_c8,(Int)pcVar2->Line);
      pVVar3 = Json::Value::operator[]((Value *)local_78,&kLINE_NUMBER_KEY_abi_cxx11_);
      Json::Value::operator=(pVVar3,&local_c8);
      Json::Value::~Value(&local_c8);
    }
    cmListFileBacktrace::Top((cmListFileBacktrace *)local_40);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      pcVar2 = cmListFileBacktrace::Top((cmListFileBacktrace *)local_40);
      Json::Value::Value(&local_f0,&pcVar2->Name);
      pVVar3 = Json::Value::operator[]((Value *)local_78,&kNAME_KEY_abi_cxx11_);
      Json::Value::operator=(pVVar3,&local_f0);
      Json::Value::~Value(&local_f0);
    }
    Json::Value::append(__return_storage_ptr__,(Value *)local_78);
    cmListFileBacktrace::Pop(&local_110,(cmListFileBacktrace *)local_40);
    cmListFileBacktrace::operator=((cmListFileBacktrace *)local_40,&local_110);
    cmListFileBacktrace::~cmListFileBacktrace(&local_110);
    Json::Value::~Value((Value *)local_78);
  }
  backtraceCopy.Cur._7_1_ = 1;
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_40);
  if ((backtraceCopy.Cur._7_1_ & 1) == 0) {
    Json::Value::~Value(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

static Json::Value DumpBacktrace(const cmListFileBacktrace& backtrace)
{
  Json::Value result = Json::arrayValue;

  cmListFileBacktrace backtraceCopy = backtrace;
  while (!backtraceCopy.Top().FilePath.empty()) {
    Json::Value entry = Json::objectValue;
    entry[kPATH_KEY] = backtraceCopy.Top().FilePath;
    if (backtraceCopy.Top().Line) {
      entry[kLINE_NUMBER_KEY] = (int)backtraceCopy.Top().Line;
    }
    if (!backtraceCopy.Top().Name.empty()) {
      entry[kNAME_KEY] = backtraceCopy.Top().Name;
    }
    result.append(std::move(entry));
    backtraceCopy = backtraceCopy.Pop();
  }
  return result;
}